

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.c
# Opt level: O1

void set_switch(ecs_world_t *world,ecs_table_t *table,ecs_data_t *data,int32_t row,int32_t count,
               ecs_entities_t *entities,_Bool reset)

{
  int iVar1;
  ecs_entity_t *peVar2;
  ecs_switch_t *sw;
  int32_t iVar3;
  long lVar4;
  uint64_t value;
  int32_t iVar5;
  ulong add;
  
  iVar1 = entities->count;
  if (0 < (long)iVar1) {
    peVar2 = entities->array;
    lVar4 = 0;
    do {
      if ((char)(peVar2[lVar4] >> 0x38) == -4) {
        add = peVar2[lVar4] & 0xffffffffffffff;
        if (reset) {
          value = 0;
        }
        else {
          _ecs_assert(add != 0,0xc,(char *)0x0,"sw_case != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                      ,0x314);
          value = add;
          if (add == 0) {
            __assert_fail("sw_case != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                          ,0x314,
                          "void set_switch(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entities_t *, _Bool)"
                         );
          }
        }
        iVar3 = ecs_table_switch_from_case(world,table,add);
        _ecs_assert(iVar3 != -1,0xc,(char *)0x0,"sw_index != -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x318);
        if (iVar3 == -1) {
          __assert_fail("sw_index != -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                        ,0x318,
                        "void set_switch(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entities_t *, _Bool)"
                       );
        }
        sw = data->sw_columns[iVar3].data;
        _ecs_assert(sw != (ecs_switch_t *)0x0,0xc,(char *)0x0,"sw != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                    ,0x31a);
        if (sw == (ecs_switch_t *)0x0) {
          __assert_fail("sw != ((void*)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O1/flecs-clone-prefix/src/flecs-clone/src/entity.c"
                        ,0x31a,
                        "void set_switch(ecs_world_t *, ecs_table_t *, ecs_data_t *, int32_t, int32_t, ecs_entities_t *, _Bool)"
                       );
        }
        iVar3 = row;
        iVar5 = count;
        if (0 < count) {
          do {
            ecs_switch_set(sw,iVar3,value);
            iVar3 = iVar3 + 1;
            iVar5 = iVar5 + -1;
          } while (iVar5 != 0);
        }
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 != iVar1);
  }
  return;
}

Assistant:

static
void set_switch(
    ecs_world_t *world,
    ecs_table_t *table,
    ecs_data_t * data,
    int32_t row,
    int32_t count,    
    ecs_entities_t *entities,
    bool reset)
{
    ecs_entity_t *array = entities->array;
    int32_t i, comp_count = entities->count;

    for (i = 0; i < comp_count; i ++) {
        ecs_entity_t e = array[i];

        if (ECS_HAS_ROLE(e, CASE)) {
            e = e & ECS_COMPONENT_MASK;

            ecs_entity_t sw_case = 0;
            if (!reset) {
                sw_case = e;
                ecs_assert(sw_case != 0, ECS_INTERNAL_ERROR, NULL);
            }

            int32_t sw_index = ecs_table_switch_from_case(world, table, e);
            ecs_assert(sw_index != -1, ECS_INTERNAL_ERROR, NULL);
            ecs_switch_t *sw = data->sw_columns[sw_index].data;
            ecs_assert(sw != NULL, ECS_INTERNAL_ERROR, NULL);
            
            int32_t r;
            for (r = 0; r < count; r ++) {
                ecs_switch_set(sw, row + r, sw_case);
            }
        }
    }
}